

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerBailOnNotStackArgs(Lowerer *this,Instr *instr)

{
  IRKind IVar1;
  bool bVar2;
  ValueType valueType;
  LabelInstr *target;
  RegOpnd *opnd;
  Instr *instr_00;
  IntConstOpnd *compareSrc2;
  undefined1 *puVar3;
  Lowerer *this_00;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseldLenDstOpnd;
  
  bVar2 = Func::GetHasStackArgs(this->m_func);
  if (bVar2) {
    target = (LabelInstr *)instr->m_next;
    autoReuseldLenDstOpnd._16_8_ = instr->m_prev;
    IVar1 = (target->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      target = IR::LabelInstr::New(Label,this->m_func,false);
      IR::Instr::InsertAfter(instr,&target->super_Instr);
    }
    bVar2 = Func::IsInlinee(instr->m_func);
    if (bVar2) {
      IR::Instr::Remove(instr);
    }
    else {
      opnd = IR::RegOpnd::New(TyUint32,instr->m_func);
      local_50 = (undefined1  [8])0x0;
      IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_50,&opnd->super_Opnd,instr->m_func,true);
      instr_00 = IR::Instr::New(LdLen_A,&opnd->super_Opnd,instr->m_func);
      valueType = ValueType::GetTaggedInt();
      IR::Opnd::SetValueType(&opnd->super_Opnd,valueType);
      IR::Instr::InsertBefore(instr,instr_00);
      GenerateFastRealStackArgumentsLdLen(this,instr_00);
      this_00 = (Lowerer *)0xf;
      compareSrc2 = IR::IntConstOpnd::New(0xf,TyUint32,this->m_func,true);
      InsertCompareBranch(this_00,&opnd->super_Opnd,&compareSrc2->super_Opnd,BrLt_A,true,target,
                          instr,false);
      GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
    }
    return (Instr *)autoReuseldLenDstOpnd._16_8_;
  }
  puVar3 = (undefined1 *)__cxa_allocate_exception(1);
  *puVar3 = 0x24;
  __cxa_throw(puVar3,&Js::RejitException::typeinfo,0);
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotStackArgs(IR::Instr * instr)
{
    if (!this->m_func->GetHasStackArgs())
    {
        throw Js::RejitException(RejitReason::InlineApplyDisabled);
    }

    IR::Instr * prevInstr = instr->m_prev;

    // Bail out test
    // Label to skip Bailout and continue
    IR::LabelInstr * continueLabelInstr;
    IR::Instr *instrNext = instr->m_next;
    if (instrNext->IsLabelInstr())
    {
        continueLabelInstr = instrNext->AsLabelInstr();
    }
    else
    {
        continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
        instr->InsertAfter(continueLabelInstr);
    }

    if (!instr->m_func->IsInlinee())
    {
        //BailOut if the number of actuals (except "this" argument) is greater than or equal to 15.
        IR::RegOpnd* ldLenDstOpnd = IR::RegOpnd::New(TyUint32, instr->m_func);
        const IR::AutoReuseOpnd autoReuseldLenDstOpnd(ldLenDstOpnd, instr->m_func);
        IR::Instr* ldLen = IR::Instr::New(Js::OpCode::LdLen_A, ldLenDstOpnd, instr->m_func);
        ldLenDstOpnd->SetValueType(ValueType::GetTaggedInt()); //LdLen_A works only on stack arguments
        instr->InsertBefore(ldLen);
        this->GenerateFastRealStackArgumentsLdLen(ldLen);
        this->InsertCompareBranch(ldLenDstOpnd, IR::IntConstOpnd::New(Js::InlineeCallInfo::MaxInlineeArgoutCount, TyUint32, m_func, true),  Js::OpCode::BrLt_A, true, continueLabelInstr, instr);
        this->GenerateBailOut(instr, nullptr, nullptr);
    }
    else
    {
        //For Inlined functions, we are sure actuals can't exceed Js::InlineeCallInfo::MaxInlineeArgoutCount (15).
        //No need to bail out.
        instr->Remove();
    }

    return prevInstr;
}